

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char>
fmt::v11::detail::
do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,big_decimal_fp *f,format_specs *specs,sign s,int exp_upper,
          locale_ref loc)

{
  byte bVar1;
  long lVar2;
  basic_appender<char> bVar3;
  int iVar4;
  ulong uVar5;
  int **ppiVar6;
  size_t sVar7;
  uint uVar8;
  int **ppiVar9;
  long lVar10;
  ulong uVar11;
  undefined1 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  char cVar15;
  basic_specs significand_00;
  uint uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  buffer<char> *buf;
  char decimal_point;
  char zero;
  bool pointy;
  int significand_size;
  char *significand;
  int exp;
  anon_class_40_8_fd1bf2f9 write;
  int num_zeros;
  undefined1 local_e6 [6];
  int local_e0;
  undefined1 local_dc [12];
  big_decimal_fp *local_d0;
  format_specs local_c8;
  undefined1 local_b8 [20];
  undefined1 auStack_a4 [20];
  format_specs *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  char *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  int *local_60;
  int *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  significand_00 = (basic_specs)f->significand;
  uVar16 = f->significand_size;
  local_d0 = (big_decimal_fp *)(ulong)uVar16;
  uVar5 = (ulong)((uVar16 + 1) - (uint)(s == none));
  local_e6[1] = '0';
  uVar8 = (specs->super_basic_specs).data_;
  local_e6[0] = '.';
  local_e0 = uVar16;
  local_dc._0_4_ = s;
  local_dc._4_8_ = out.container;
  local_c8.super_basic_specs = significand_00;
  local_c8.width = exp_upper;
  if ((uVar8 >> 0xe & 1) != 0) {
    local_e6[0] = decimal_point_impl<char>(loc);
    uVar16 = (uint)local_d0;
    uVar8 = (specs->super_basic_specs).data_;
  }
  uVar14 = auStack_a4._4_8_;
  uVar13 = local_dc._4_8_;
  uVar17 = f->exponent;
  iVar18 = uVar16 + uVar17;
  iVar4 = specs->precision;
  bVar1 = (byte)uVar8 & 7;
  local_d0 = f;
  if (bVar1 == 1) goto LAB_0022fad6;
  if ((uVar8 & 7) != 2) {
    if (iVar18 < -3) {
LAB_0022fad6:
      iVar19 = uVar16 + uVar17 + -1;
      if ((uVar8 >> 0xd & 1) == 0) {
        uVar11 = 0;
        if (uVar16 == 1) {
          local_e6[0] = '\0';
          uVar11 = 0;
        }
      }
      else {
        uVar11 = 0;
        if (0 < (int)(iVar4 - uVar16)) {
          uVar11 = (ulong)(iVar4 - uVar16);
        }
        uVar5 = uVar5 + uVar11;
      }
      uVar12 = local_e6[0];
      iVar4 = 1 - iVar18;
      if (0 < iVar18) {
        iVar4 = iVar19;
      }
      lVar10 = 2;
      if (99 < iVar4) {
        lVar10 = (ulong)(999 < iVar4) + 3;
      }
      sVar7 = (3 - (ulong)(local_e6[0] == '\0')) + uVar5 + lVar10;
      local_b8._0_4_ = s;
      auStack_a4[0] = local_e6[0];
      local_b8._16_4_ = uVar16;
      auStack_a4._4_5_ = CONCAT14('0',(int)uVar11);
      auStack_a4._10_2_ = SUB82(uVar14,6);
      auStack_a4._4_8_ =
           CONCAT26(auStack_a4._10_2_,CONCAT15(((uVar8 >> 0xc & 1) == 0) << 5,auStack_a4._4_5_)) |
           0x450000000000;
      auStack_a4._12_4_ = iVar19;
      local_b8._8_8_ = significand_00;
      if (specs->width < 1) {
        uVar5 = sVar7 + *(size_t *)(local_dc._4_8_ + 8);
        if (*(size_t *)(local_dc._4_8_ + 0x10) < uVar5) {
          (**(grow_fun *)(local_dc._4_8_ + 0x18))((buffer<char> *)local_dc._4_8_,uVar5);
        }
        iVar4 = (int)uVar11;
        if (s != none) {
          sVar7 = *(size_t *)(uVar13 + 8);
          uVar5 = sVar7 + 1;
          if (*(size_t *)(uVar13 + 0x10) < uVar5) {
            (**(grow_fun *)(uVar13 + 0x18))((buffer<char> *)uVar13,uVar5);
            sVar7 = *(size_t *)(uVar13 + 8);
            uVar5 = sVar7 + 1;
          }
          *(ulong *)(uVar13 + 8) = uVar5;
          (*(char **)uVar13)[sVar7] = (char)(0x202b2d00 >> ((byte)(s << 3) & 0x1f));
          significand_00 = (basic_specs)local_b8._8_8_;
          uVar12 = auStack_a4[0];
          iVar4 = auStack_a4._4_4_;
          uVar16 = local_b8._16_4_;
        }
        bVar3 = write_significand<fmt::v11::basic_appender<char>,char>
                          ((basic_appender<char>)uVar13,(char *)significand_00,uVar16,1,uVar12);
        if (0 < iVar4) {
          bVar3 = fill_n<fmt::v11::basic_appender<char>,int,char>(bVar3,iVar4,auStack_a4 + 8);
        }
        uVar12 = auStack_a4[9];
        sVar7 = (bVar3.container)->size_;
        uVar5 = sVar7 + 1;
        if ((bVar3.container)->capacity_ < uVar5) {
          (*(bVar3.container)->grow_)(bVar3.container,uVar5);
          sVar7 = (bVar3.container)->size_;
          uVar5 = sVar7 + 1;
        }
        (bVar3.container)->size_ = uVar5;
        (bVar3.container)->ptr_[sVar7] = uVar12;
        bVar3 = write_exponent<char,fmt::v11::basic_appender<char>>(auStack_a4._12_4_,bVar3);
      }
      else {
        bVar3 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                          ((basic_appender<char>)local_dc._4_8_,specs,sVar7,sVar7,
                           (anon_class_40_8_fd1bf2f9 *)local_b8);
      }
      return (basic_appender<char>)bVar3.container;
    }
    iVar19 = local_c8.width;
    if (0 < iVar4) {
      iVar19 = iVar4;
    }
    if (iVar19 < iVar18) goto LAB_0022fad6;
  }
  local_c8.precision = iVar18;
  if (-1 < (int)uVar17) {
    lVar10 = uVar17 + uVar5;
    local_e6._2_4_ = iVar4 - iVar18;
    if ((uVar8 >> 0xd & 1) != 0) {
      lVar10 = lVar10 + 1;
      if (((int)local_e6._2_4_ < 1) && (bVar1 != 2)) {
        local_e6._2_4_ = 0;
      }
      else if (0 < (int)local_e6._2_4_) {
        lVar10 = lVar10 + (ulong)(uint)local_e6._2_4_;
      }
    }
    digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
              ((digit_grouping<char> *)&local_70,loc,(bool)((byte)(uVar8 >> 0xe) & 1));
    iVar4 = 0;
    if (local_48 != (digit_grouping<char> *)0x0) {
      ppiVar9 = (int **)(local_70._8_8_ + local_70._M_allocated_capacity);
      lVar2 = 0;
      uVar13 = local_70._0_8_;
      do {
        if ((int **)uVar13 == ppiVar9) {
          cVar15 = *(char *)((long)ppiVar9 + -1);
          uVar13 = ppiVar9;
        }
        else {
          cVar15 = *(char *)uVar13;
          if ((byte)(cVar15 + 0x81U) < 0x82) goto LAB_0022fd97;
          uVar13 = (int **)(uVar13 + 1);
        }
        iVar4 = iVar4 + cVar15;
        if (iVar18 <= iVar4) goto LAB_0022fd97;
        lVar2 = lVar2 + 1;
      } while( true );
    }
    lVar2 = 0;
LAB_0022fd97:
    local_b8._0_8_ = local_dc;
    local_b8._8_8_ = &local_c8;
    unique0x10000482 = &local_e0;
    auStack_a4._4_8_ = local_d0;
    local_88._M_allocated_capacity = (size_type)local_e6;
    local_88._8_8_ = local_e6 + 2;
    local_78 = local_e6 + 1;
    auStack_a4._12_8_ = &local_70;
    local_90 = specs;
    bVar3 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_2_&>
                      ((basic_appender<char>)local_dc._4_8_,specs,lVar10 + lVar2,lVar10 + lVar2,
                       (anon_class_72_9_eb40e20e *)local_b8);
    if (local_50 != &local_40) {
      operator_delete(local_50,(ulong)(local_40._M_allocated_capacity + 1));
    }
    uVar13 = local_60;
    uVar14 = local_70._0_8_;
    if ((int **)local_70._0_8_ == &local_60) {
      return (basic_appender<char>)bVar3.container;
    }
LAB_0022ff6b:
    operator_delete((void *)uVar14,uVar13 + 1);
    return (basic_appender<char>)bVar3.container;
  }
  if (0 < iVar18) {
    uVar17 = 0;
    local_e6._2_4_ = iVar4 - uVar16 & (int)(uVar8 << 0x12) >> 0x1f;
    uVar16 = local_e6._2_4_;
    if ((int)local_e6._2_4_ < 1) {
      uVar16 = uVar17;
    }
    digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
              ((digit_grouping<char> *)local_b8,loc,(bool)((byte)(uVar8 >> 0xe) & 1));
    if (local_90 != (format_specs *)0x0) {
      ppiVar6 = (int **)(local_b8._0_8_ + (long)(basic_specs *)local_b8._8_8_);
      lVar10 = 0;
      ppiVar9 = (int **)local_b8._0_8_;
      do {
        if (ppiVar9 == ppiVar6) {
          cVar15 = *(char *)((long)ppiVar6 + -1);
          ppiVar9 = ppiVar6;
        }
        else {
          cVar15 = *(char *)ppiVar9;
          if ((byte)(cVar15 + 0x81U) < 0x82) goto LAB_0022feda;
          ppiVar9 = (int **)((long)ppiVar9 + 1);
        }
        uVar17 = uVar17 + (int)cVar15;
        if (iVar18 <= (int)uVar17) goto LAB_0022feda;
        lVar10 = lVar10 + 1;
      } while( true );
    }
    lVar10 = 0;
LAB_0022feda:
    sVar7 = uVar16 + uVar5 + lVar10 + 1;
    local_70._M_allocated_capacity = (size_type)local_dc;
    local_70._8_8_ = &local_c8;
    local_60 = &local_e0;
    local_58 = &local_c8.precision;
    local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_e6;
    local_40._M_allocated_capacity = (size_type)(local_e6 + 2);
    local_40._8_8_ = local_e6 + 1;
    local_48 = (digit_grouping<char> *)local_b8;
    bVar3 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_3_&>
                      ((basic_appender<char>)local_dc._4_8_,specs,sVar7,sVar7,
                       (anon_class_64_8_085c650e *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)auStack_a4._12_8_ != &local_88) {
      operator_delete((void *)auStack_a4._12_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    uVar13 = stack0xffffffffffffff58;
    uVar14 = local_b8._0_8_;
    if ((undefined1 *)local_b8._0_8_ == local_b8 + 0x10) {
      return (basic_appender<char>)bVar3.container;
    }
    goto LAB_0022ff6b;
  }
  iVar19 = -iVar18;
  local_70._M_allocated_capacity._0_4_ = iVar19;
  if (uVar16 == 0) {
    if (SBORROW4(iVar4,iVar19) != iVar4 + iVar18 < 0 && -1 < iVar4) {
      local_70._M_allocated_capacity._0_4_ = iVar4;
      iVar19 = iVar4;
    }
    if (iVar19 == 0) {
      local_e6[2] = (char)((uVar8 & 0x2000) >> 0xd);
      iVar4 = 2 - (uint)((uVar8 & 0x2000) == 0);
      iVar19 = 0;
      goto LAB_0022fe71;
    }
  }
  local_e6[2] = 1;
  iVar4 = 2;
LAB_0022fe71:
  sVar7 = (uint)(iVar19 + iVar4) + uVar5;
  local_b8._0_8_ = local_dc;
  local_b8._8_8_ = local_e6 + 2;
  unique0x00004e80 = local_e6;
  auStack_a4._4_8_ = &local_70;
  auStack_a4._12_8_ = local_e6 + 1;
  local_90 = &local_c8;
  local_88._M_allocated_capacity = (size_type)&local_e0;
  bVar3 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_4_&>
                    ((basic_appender<char>)local_dc._4_8_,specs,sVar7,sVar7,
                     (anon_class_56_7_88befd79 *)local_b8);
  return (basic_appender<char>)bVar3.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs& specs, sign s,
                                    int exp_upper, locale_ref loc) -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  size_t size = to_unsigned(significand_size) + (s != sign::none ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point = specs.localized() ? detail::decimal_point<Char>(loc)
                                         : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (specs.type() == presentation_type::exp) return true;
    if (specs.type() == presentation_type::fixed) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4;
    return output_exp < exp_lower ||
           output_exp >= (specs.precision > 0 ? specs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (specs.alt()) {
      num_zeros = specs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = specs.upper() ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0
               ? write_padded<Char, align::right>(out, specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = specs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (specs.alt()) {
      ++size;
      if (num_zeros <= 0 && specs.type() != presentation_type::fixed)
        num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!specs.alt()) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = specs.alt() ? specs.precision - significand_size : 0;
    size += 1 + static_cast<unsigned>(max_of(num_zeros, 0));
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && specs.precision >= 0 &&
      specs.precision < num_zeros) {
    num_zeros = specs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || specs.alt();
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
    if (s != sign::none) *it++ = detail::getsign<Char>(s);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}